

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_cjson.c
# Opt level: O2

void json_append_number(lua_State *l,json_config_t *cfg,strbuf_t *json,int lindex)

{
  int iVar1;
  char *c;
  lua_Number num;
  int iStack_30;
  
  num = lua_tonumberx(l,lindex,(int *)0x0);
  if (cfg->encode_invalid_numbers != 1) {
    if (cfg->encode_invalid_numbers == 0) {
      if (0x7fefffffffffffff < (ulong)ABS(num)) {
        json_encode_exception(l,cfg,json,lindex,"must not be NaN or Infinity");
      }
    }
    else if (0x7fefffffffffffff < (ulong)ABS(num)) {
      c = "null";
      iStack_30 = 4;
      goto LAB_00138af5;
    }
LAB_00138ab6:
    strbuf_ensure_empty_length(json,0x20);
    iVar1 = fpconv_g_fmt(json->buf + json->length,num,cfg->encode_number_precision);
    json->length = json->length + iVar1;
    return;
  }
  if (NAN(num)) {
    c = "NaN";
    iStack_30 = 3;
  }
  else {
    if (ABS(num) != INFINITY) goto LAB_00138ab6;
    if (0.0 <= num) {
      c = "Infinity";
      iStack_30 = 8;
    }
    else {
      c = "-Infinity";
      iStack_30 = 9;
    }
  }
LAB_00138af5:
  strbuf_append_mem(json,c,iStack_30);
  return;
}

Assistant:

static void json_append_number(lua_State *l, json_config_t *cfg,
                               strbuf_t *json, int lindex)
{
    double num = lua_tonumber(l, lindex);
    int len;

    if (cfg->encode_invalid_numbers == 0) {
        /* Prevent encoding invalid numbers */
        if (isinf(num) || isnan(num))
            json_encode_exception(l, cfg, json, lindex,
                                  "must not be NaN or Infinity");
    } else if (cfg->encode_invalid_numbers == 1) {
        /* Encode NaN/Infinity separately to ensure Javascript compatible
         * values are used. */
        if (isnan(num)) {
            strbuf_append_mem(json, "NaN", 3);
            return;
        }
        if (isinf(num)) {
            if (num < 0)
                strbuf_append_mem(json, "-Infinity", 9);
            else
                strbuf_append_mem(json, "Infinity", 8);
            return;
        }
    } else {
        /* Encode invalid numbers as "null" */
        if (isinf(num) || isnan(num)) {
            strbuf_append_mem(json, "null", 4);
            return;
        }
    }

    strbuf_ensure_empty_length(json, FPCONV_G_FMT_BUFSIZE);
    len = fpconv_g_fmt(strbuf_empty_ptr(json), num, cfg->encode_number_precision);
    strbuf_extend_length(json, len);
}